

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

sexp_conflict
sexp_getpwnam_r_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict res4;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  passwd **tmp4;
  passwd *tmp1;
  int err;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  sexp_conflict *local_60;
  undefined8 local_58;
  sexp_conflict local_50;
  passwd **local_48;
  passwd *local_40;
  int local_34;
  int *local_30;
  int *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_34 = 0;
  local_50 = (sexp_conflict)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_60,0,0x10);
  local_68 = 0x43e;
  memset(&local_78,0,0x10);
  local_80 = 0x43e;
  memset(&local_90,0,0x10);
  if ((((ulong)local_28 & 3) == 0) && (*local_28 == 9)) {
    if ((((ulong)local_30 & 3) == 0) && (*local_30 == 9)) {
      local_60 = &local_50;
      local_58 = *(undefined8 *)(local_10 + 0x6080);
      *(sexp_conflict ***)(local_10 + 0x6080) = &local_60;
      local_78 = &local_68;
      local_70 = *(undefined8 *)(local_10 + 0x6080);
      *(undefined8 ***)(local_10 + 0x6080) = &local_78;
      local_90 = &local_80;
      local_88 = *(undefined8 *)(local_10 + 0x6080);
      *(undefined8 ***)(local_10 + 0x6080) = &local_90;
      local_40 = (passwd *)calloc(1,0x31);
      local_48 = (passwd **)calloc(1,9);
      local_34 = getpwnam_r((char *)(*(long *)(local_28 + 2) + 0x10 + *(long *)(local_28 + 4)),
                            local_40,(char *)(*(long *)(local_30 + 2) + 0x10 +
                                             *(long *)(local_30 + 4)),*(size_t *)(local_30 + 6),
                            local_48);
      if (local_34 == 0) {
        auVar2._8_8_ = (long)*(ulong *)(local_18 + 0x38) >> 0x3f;
        auVar2._0_8_ = *(ulong *)(local_18 + 0x38) & 0xfffffffffffffffe;
        local_68 = sexp_make_cpointer(local_10,SUB168(auVar2 / SEXT816(2),0),local_40,local_30,1);
        uVar1 = *(ulong *)(*(long *)(local_18 + 0x48) + 0x18);
        auVar3._8_8_ = (long)uVar1 >> 0x3f;
        auVar3._0_8_ = uVar1 & 0xfffffffffffffffe;
        local_80 = sexp_make_cpointer(local_10,SUB168(auVar3 / SEXT816(2),0),local_48,0x3e,1);
        local_50 = (sexp_conflict)0x23e;
        sexp_push_op(local_10,&local_50,local_80);
        sexp_push_op(local_10,&local_50,local_68);
      }
      else {
        local_50 = (sexp_conflict)0x3e;
      }
      *(undefined8 *)(local_10 + 0x6080) = local_58;
      local_8 = local_50;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,9,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,9,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_getpwnam_r_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  struct passwd* tmp1;
  struct passwd* *tmp4;
  sexp_gc_var3(res, res1, res4);
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg2))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg2);
  sexp_gc_preserve3(ctx, res, res1, res4);
  tmp1 = (struct passwd*) calloc(1, 1 + sizeof(tmp1[0]));
  tmp4 = (struct passwd**) calloc(1, 1 + sizeof(tmp4[0]));
  err = getpwnam_r(sexp_string_data(arg0), tmp1, sexp_string_data(arg2), sexp_string_size(arg2), tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, arg2, 1);
  res4 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ONE)), tmp4, SEXP_FALSE, 1);
  res = SEXP_NULL;
  sexp_push(ctx, res, res4);
  sexp_push(ctx, res, res1);
  }
  sexp_gc_release3(ctx);
  return res;
}